

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O1

int __thiscall cppcms::http::details::async_io_buf::overflow(async_io_buf *this,int c)

{
  undefined1 *puVar1;
  long lVar2;
  pointer pcVar3;
  pointer pcVar4;
  int iVar5;
  size_type __new_size;
  
  if (this->full_buffering_ == true) {
    lVar2 = *(long *)&(this->super_basic_device).super_extended_streambuf.field_0x28;
    if (lVar2 == *(long *)&(this->super_basic_device).super_extended_streambuf.field_0x30) {
      pcVar3 = (this->super_basic_device).output_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar4 = (this->super_basic_device).output_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __new_size = 0x40;
      if (pcVar3 != pcVar4) {
        __new_size = ((long)pcVar3 - (long)pcVar4) * 2;
      }
      iVar5 = *(int *)&(this->super_basic_device).super_extended_streambuf.field_0x20;
      std::vector<char,_std::allocator<char>_>::resize
                (&(this->super_basic_device).output_,__new_size);
      pcVar3 = (this->super_basic_device).output_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar4 = (this->super_basic_device).output_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)&(this->super_basic_device).super_extended_streambuf.field_0x20 = pcVar3;
      *(pointer *)&(this->super_basic_device).super_extended_streambuf.field_0x30 = pcVar4;
      *(pointer *)&(this->super_basic_device).super_extended_streambuf.field_0x28 =
           pcVar3 + ((int)lVar2 - iVar5);
    }
    if (c != -1) {
      **(undefined1 **)&(this->super_basic_device).super_extended_streambuf.field_0x28 = (char)c;
      puVar1 = &(this->super_basic_device).super_extended_streambuf.field_0x28;
      *(long *)puVar1 = *(long *)puVar1 + 1;
    }
    return 0;
  }
  iVar5 = basic_device::overflow(&this->super_basic_device,c);
  return iVar5;
}

Assistant:

virtual int overflow(int c)
		{
			if(full_buffering_) {
				if(pptr() ==  epptr()) {
					size_t current_size = pptr() - pbase();
					output_.resize(next_size(output_.size()));
					setp(&output_[0],&output_[output_.size()-1]+1);
					pbump(current_size);
				}
				if(c!=EOF) {
					*pptr() = c;
					pbump(1);
				}
				return 0;
			}
			else {
				return basic_device::overflow(c);
			}
		}